

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O2

void __thiscall
bgui::ImageAdapter<float>::getPixel
          (ImageAdapter<float> *this,double *r,double *g,double *b,float x,float y,int ir,int ig,
          int ib)

{
  double dVar1;
  pointer pIVar2;
  float ***pppfVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  float fVar9;
  work_t wVar10;
  double dVar11;
  double dVar12;
  float fVar13;
  
  if ((this->mipmap).
      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->mipmap).
      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar5 = (long)x;
    lVar6 = (long)y;
    pppfVar3 = this->image->img;
    *r = (double)pppfVar3[ir][lVar6][lVar5];
    *g = (double)pppfVar3[ig][lVar6][lVar5];
    dVar11 = (double)pppfVar3[ib][lVar6][lVar5];
  }
  else {
    dVar11 = log(1.0 / (this->super_ImageAdapterBase).scale);
    uVar4 = (int)(dVar11 / 0.6931471805599453) - 1;
    pIVar2 = (this->mipmap).
             super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (int)(((long)(this->mipmap).
                         super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) / 0x38) - 1;
    if ((int)uVar4 < (int)uVar8) {
      uVar8 = uVar4;
    }
    uVar4 = uVar8 + 1;
    iVar7 = 1 << ((byte)uVar4 & 0x1f);
    if ((int)uVar8 < 0) {
      wVar10 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear(this->image,x,y,ir);
      *r = (double)wVar10;
      wVar10 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear(this->image,x,y,ig);
      *g = (double)wVar10;
      wVar10 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear(this->image,x,y,ib);
      *b = (double)wVar10;
      if (uVar8 != 0xffffffff) {
        return;
      }
    }
    else {
      fVar13 = (float)iVar7;
      fVar9 = x / fVar13;
      fVar13 = y / fVar13;
      wVar10 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                         (pIVar2 + uVar8,fVar9,fVar13,ir);
      *r = (double)wVar10;
      wVar10 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                         ((this->mipmap).
                          super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar8,fVar9,fVar13,ig);
      *g = (double)wVar10;
      wVar10 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                         ((this->mipmap).
                          super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar8,fVar9,fVar13,ib);
      *b = (double)wVar10;
    }
    pIVar2 = (this->mipmap).
             super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(this->mipmap).
                     super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) / 0x38) <=
        (int)uVar4) {
      return;
    }
    dVar11 = (double)iVar7;
    dVar11 = (1.0 / (this->super_ImageAdapterBase).scale - dVar11) / dVar11;
    if (dVar11 <= 1e-06) {
      return;
    }
    dVar12 = 1.0 - dVar11;
    fVar13 = (float)(2 << ((byte)uVar4 & 0x1f));
    fVar9 = x / fVar13;
    fVar13 = y / fVar13;
    dVar1 = *r;
    wVar10 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                       (pIVar2 + uVar4,fVar9,fVar13,ir);
    *r = (double)wVar10 * dVar11 + dVar1 * dVar12;
    dVar1 = *g;
    wVar10 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                       ((this->mipmap).
                        super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar4,fVar9,fVar13,ig);
    *g = (double)wVar10 * dVar11 + dVar1 * dVar12;
    dVar1 = *b;
    wVar10 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                       ((this->mipmap).
                        super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar4,fVar9,fVar13,ib);
    dVar11 = (double)wVar10 * dVar11 + dVar12 * dVar1;
  }
  *b = dVar11;
  return;
}

Assistant:

void getPixel(double &r, double &g, double &b, float x, float y,
                  int ir, int ig, int ib) const
    {
      if (mipmap.size() > 0)
      {
        int j=static_cast<int>(log(1/scale)/log(2))-1;
        j=std::min(static_cast<int>(mipmap.size())-1, j);

        int ds=1<<(j+1);

        if (j < 0)
        {
          r=image->getBilinear(x, y, ir);
          g=image->getBilinear(x, y, ig);
          b=image->getBilinear(x, y, ib);
        }
        else
        {
          r=mipmap[j].getBilinear(x/ds, y/ds, ir);
          g=mipmap[j].getBilinear(x/ds, y/ds, ig);
          b=mipmap[j].getBilinear(x/ds, y/ds, ib);
        }

        if (j+1 >= 0 && j+1 < static_cast<int>(mipmap.size()))
        {
          double f=(1/scale-ds)/ds;

          if (f > 1e-6)
          {
            r=(1-f)*r+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ir);
            g=(1-f)*g+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ig);
            b=(1-f)*b+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ib);
          }
        }

        return;
      }

      r=image->get(static_cast<long>(x), static_cast<long>(y), ir);
      g=image->get(static_cast<long>(x), static_cast<long>(y), ig);
      b=image->get(static_cast<long>(x), static_cast<long>(y), ib);
    }